

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunction::ExtractSnapObjectDataInto
          (ScriptFunction *this,SnapObject *objData,SlabAllocator *alloc)

{
  FunctionInfo *pFVar1;
  SnapScriptFunctionInfo *addtlInfo;
  SnapScriptFunctionInfo *ssfi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  ScriptFunction *this_local;
  
  pFVar1 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)this);
  if (pFVar1 == (FunctionInfo *)0x0) {
    TTDAbort_unrecoverable_error("We are only doing this for functions with ParseableFunctionInfo.")
    ;
  }
  addtlInfo = TTD::SlabAllocatorBase<0>::
              SlabAllocateStruct<TTD::NSSnapObjects::SnapScriptFunctionInfo>(alloc);
  (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x7b])(this,addtlInfo,alloc);
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)4>
            (objData,addtlInfo);
  return;
}

Assistant:

void ScriptFunction::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTDAssert(this->GetFunctionInfo() != nullptr, "We are only doing this for functions with ParseableFunctionInfo.");

        TTD::NSSnapObjects::SnapScriptFunctionInfo* ssfi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapScriptFunctionInfo>();

        this->ExtractSnapObjectDataIntoSnapScriptFunctionInfo(ssfi, alloc);

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapScriptFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapScriptFunctionObject>(objData, ssfi);
    }